

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PrintTo(Hunk *this,ostream *os)

{
  const_iterator cVar1;
  bool bVar2;
  pointer ppVar3;
  ostream *poVar4;
  iterator local_38;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_30;
  iterator local_28;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_20;
  const_iterator it;
  ostream *os_local;
  Hunk *this_local;
  
  it._M_node = (_List_node_base *)os;
  PrintHeader(this,os);
  FlushEdits(this);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::begin
                 (&this->hunk_);
  std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
            (&local_20,&local_28);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::end
                   (&this->hunk_);
    std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
              (&local_30,&local_38);
    bVar2 = std::operator!=(&local_20,&local_30);
    cVar1 = it;
    if (!bVar2) break;
    ppVar3 = std::_List_const_iterator<std::pair<char,_const_char_*>_>::operator->(&local_20);
    poVar4 = std::operator<<((ostream *)cVar1._M_node,ppVar3->first);
    ppVar3 = std::_List_const_iterator<std::pair<char,_const_char_*>_>::operator->(&local_20);
    poVar4 = std::operator<<(poVar4,ppVar3->second);
    std::operator<<(poVar4,"\n");
    std::_List_const_iterator<std::pair<char,_const_char_*>_>::operator++(&local_20);
  }
  return;
}

Assistant:

void PrintTo(std::ostream* os) {
    PrintHeader(os);
    FlushEdits();
    for (std::list<std::pair<char, const char*> >::const_iterator it =
             hunk_.begin();
         it != hunk_.end(); ++it) {
      *os << it->first << it->second << "\n";
    }
  }